

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

bool Js::TypedArrayCompareElementsHelper<char16_t>(CompareVarsInfo *cvInfo,void *elem1,void *elem2)

{
  ushort uVar1;
  ushort uVar2;
  RecyclableObject *this;
  ScriptContext *scriptContext;
  RecyclableObject *pRVar3;
  ThreadContext *this_00;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int32 iVar7;
  undefined4 *puVar8;
  JavascriptMethod p_Var9;
  Var pvVar10;
  Var pvVar11;
  double dVar12;
  double value;
  
  if (elem1 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x865,"(element1 != nullptr)","element1 != nullptr");
    if (!bVar5) goto LAB_00c07b87;
    *puVar8 = 0;
  }
  if (elem2 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x866,"(element2 != nullptr)","element2 != nullptr");
    if (!bVar5) goto LAB_00c07b87;
    *puVar8 = 0;
  }
  if (cvInfo == (CompareVarsInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x867,"(cvInfo != nullptr)","cvInfo != nullptr");
    if (!bVar5) {
LAB_00c07b87:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  uVar1 = *elem1;
  uVar2 = *elem2;
  dVar12 = (double)uVar1;
  bVar5 = NumberUtilities::IsNan(dVar12);
  if (bVar5) {
    bVar5 = false;
  }
  else {
    value = (double)uVar2;
    bVar6 = NumberUtilities::IsNan(value);
    bVar5 = true;
    if (!bVar6) {
      this = (cvInfo->compFn).ptr;
      if (this == (RecyclableObject *)0x0) {
        bVar5 = uVar1 < uVar2;
      }
      else {
        scriptContext =
             (((((this->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
        pRVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
        this_00 = scriptContext->threadContext;
        bVar5 = this_00->reentrancySafeOrHandled;
        this_00->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
        ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
        p_Var9 = RecyclableObject::GetEntryPoint(this);
        CheckIsExecutable(this,p_Var9);
        p_Var9 = RecyclableObject::GetEntryPoint(this);
        pvVar10 = JavascriptNumber::ToVarNoCheck(dVar12,scriptContext);
        pvVar11 = JavascriptNumber::ToVarNoCheck(value,scriptContext);
        pvVar10 = (*p_Var9)(this,(CallInfo)this,0x2000003,0,0,0,0,0x2000003,pRVar3,pvVar10,pvVar11);
        this_00->reentrancySafeOrHandled = bVar5;
        bVar5 = TaggedInt::Is(pvVar10);
        if (bVar5) {
          iVar7 = TaggedInt::ToInt32(pvVar10);
          bVar5 = SUB41((uint)iVar7 >> 0x1f,0);
        }
        else {
          if ((ulong)pvVar10 >> 0x32 == 0) {
            dVar12 = JavascriptConversion::ToNumber_Full(pvVar10,scriptContext);
          }
          else {
            dVar12 = JavascriptNumber::GetValue(pvVar10);
          }
          bVar5 = dVar12 < 0.0;
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool TypedArrayCompareElementsHelper(JavascriptArray::CompareVarsInfo* cvInfo, const void* elem1, const void* elem2)
    {
        const T* element1 = static_cast<const T*>(elem1);
        const T* element2 = static_cast<const T*>(elem2);

        Assert(element1 != nullptr);
        Assert(element2 != nullptr);
        Assert(cvInfo != nullptr);

        const T x = *element1;
        const T y = *element2;

        // ECMA2023 spec requires that NaN values are sorted to the end
        if (NumberUtilities::IsNan((double)x))
        {
            return false;
        }
        else if (NumberUtilities::IsNan((double)y))
        {
            return true;
        }

        if (cvInfo->compFn != nullptr)
        {
            RecyclableObject* compFn = cvInfo->compFn;
            ScriptContext* scriptContext = compFn->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var retVal = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                retVal = CALL_FUNCTION(scriptContext->GetThreadContext(),
                            compFn, CallInfo(CallFlags_Value, 3),
                            undefined,
                            JavascriptNumber::ToVarNoCheck((double)x, scriptContext),
                            JavascriptNumber::ToVarNoCheck((double)y, scriptContext));
            }
            END_SAFE_REENTRANT_CALL

            if (TaggedInt::Is(retVal))
            {
                return TaggedInt::ToInt32(retVal) < 0;
            }

            if (JavascriptNumber::Is_NoTaggedIntCheck(retVal))
            {
                return JavascriptNumber::GetValue(retVal) < 0;
            }

            return JavascriptConversion::ToNumber_Full(retVal, scriptContext) < 0;
        }
        else // simple comparison when no user method provided
        {
            return x < y;
        }
    }